

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_compressEnd(ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize)

{
  ZSTD_compressionStage_e ZVar1;
  size_t err_code_1;
  size_t sVar2;
  size_t sVar3;
  XXH64_hash_t XVar4;
  ulong uVar5;
  size_t err_code_2;
  undefined4 *puVar6;
  size_t err_code;
  undefined4 *dst_00;
  
  sVar2 = ZSTD_compressContinue_internal(cctx,dst,dstCapacity,src,srcSize,1,1);
  sVar3 = sVar2;
  if (sVar2 < 0xffffffffffffff89) {
    ZVar1 = cctx->stage;
    if (ZVar1 == ZSTDcs_created) {
      sVar3 = 0xffffffffffffffc4;
    }
    else {
      dst_00 = (undefined4 *)((long)dst + sVar2);
      uVar5 = dstCapacity - sVar2;
      puVar6 = dst_00;
      if (ZVar1 != ZSTDcs_ending) {
        if (ZVar1 == ZSTDcs_init) {
          sVar3 = ZSTD_writeFrameHeader(dst_00,uVar5,&cctx->appliedParams,0,0);
          if (0xffffffffffffff88 < sVar3) {
            return sVar3;
          }
          uVar5 = uVar5 - sVar3;
          cctx->stage = ZSTDcs_ongoing;
          puVar6 = (undefined4 *)(sVar3 + (long)dst_00);
        }
        if (uVar5 < 4) {
          return 0xffffffffffffffba;
        }
        *puVar6 = 1;
        uVar5 = uVar5 - 3;
        puVar6 = (undefined4 *)((long)puVar6 + 3);
      }
      if ((cctx->appliedParams).fParams.checksumFlag != 0) {
        XVar4 = XXH64_digest(&cctx->xxhState);
        if (uVar5 < 4) {
          return 0xffffffffffffffba;
        }
        *puVar6 = (int)XVar4;
        puVar6 = puVar6 + 1;
      }
      cctx->stage = ZSTDcs_created;
      uVar5 = (long)puVar6 - (long)dst_00;
      sVar3 = uVar5;
      if ((uVar5 < 0xffffffffffffff89) &&
         ((cctx->pledgedSrcSizePlusOne == 0 ||
          (sVar3 = 0xffffffffffffffb8, cctx->pledgedSrcSizePlusOne == cctx->consumedSrcSize + 1))))
      {
        ZSTD_CCtx_trace(cctx,uVar5);
        sVar3 = sVar2 + uVar5;
      }
    }
  }
  return sVar3;
}

Assistant:

size_t ZSTD_compressEnd (ZSTD_CCtx* cctx,
                         void* dst, size_t dstCapacity,
                   const void* src, size_t srcSize)
{
    size_t endResult;
    size_t const cSize = ZSTD_compressContinue_internal(cctx,
                                dst, dstCapacity, src, srcSize,
                                1 /* frame mode */, 1 /* last chunk */);
    FORWARD_IF_ERROR(cSize, "ZSTD_compressContinue_internal failed");
    endResult = ZSTD_writeEpilogue(cctx, (char*)dst + cSize, dstCapacity-cSize);
    FORWARD_IF_ERROR(endResult, "ZSTD_writeEpilogue failed");
    assert(!(cctx->appliedParams.fParams.contentSizeFlag && cctx->pledgedSrcSizePlusOne == 0));
    if (cctx->pledgedSrcSizePlusOne != 0) {  /* control src size */
        ZSTD_STATIC_ASSERT(ZSTD_CONTENTSIZE_UNKNOWN == (unsigned long long)-1);
        DEBUGLOG(4, "end of frame : controlling src size");
        RETURN_ERROR_IF(
            cctx->pledgedSrcSizePlusOne != cctx->consumedSrcSize+1,
            srcSize_wrong,
             "error : pledgedSrcSize = %u, while realSrcSize = %u",
            (unsigned)cctx->pledgedSrcSizePlusOne-1,
            (unsigned)cctx->consumedSrcSize);
    }
    ZSTD_CCtx_trace(cctx, endResult);
    return cSize + endResult;
}